

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

Apply * __thiscall
jsonnet::internal::Desugarer::stdFunc
          (Desugarer *this,LocationRange *loc,UString *name,AST *a,AST *b)

{
  Apply *pAVar1;
  long lVar2;
  initializer_list<jsonnet::internal::ArgParam> __l;
  bool local_12c;
  bool local_12b;
  allocator_type local_12a;
  bool local_129;
  LocationRange *local_128;
  Index *local_120;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_118;
  void *local_100;
  void *local_f8;
  LiteralString *local_f0;
  Var *local_e8;
  ArgParam local_e0 [2];
  
  local_128 = loc;
  local_e8 = std(this);
  local_129 = false;
  local_f0 = str(this,name);
  local_f8 = (void *)0x0;
  local_100 = (void *)0x0;
  local_120 = make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                        (this,(LocationRange *)E,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_e8,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_129,&local_f0,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_f8,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_100,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF);
  ArgParam::ArgParam(local_e0,a,(Fodder *)EF);
  ArgParam::ArgParam(local_e0 + 1,b,(Fodder *)EF);
  __l._M_len = 2;
  __l._M_array = local_e0;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (&local_118,__l,&local_12a);
  local_12b = false;
  local_12c = true;
  pAVar1 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     (this,local_128,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_120,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_118,&local_12b,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_12c);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            (&local_118);
  lVar2 = 0x58;
  do {
    ArgParam::~ArgParam((ArgParam *)
                        ((long)&local_e0[0].idFodder.
                                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x58;
  } while (lVar2 != -0x58);
  return pAVar1;
}

Assistant:

Apply *stdFunc(const LocationRange &loc, const UString &name, AST *a, AST *b)
    {
        return make<Apply>(
            loc,
            EF,
            make<Index>(E, EF, std(), EF, false, str(name), EF, nullptr, EF, nullptr, EF),
            EF,
            ArgParams{{a, EF}, {b, EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
    }